

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O0

int __thiscall GoState<3U,_3U>::get_player_score(GoState<3U,_3U> *this,int player)

{
  ulong uVar1;
  uint in_ESI;
  long *in_RDI;
  int j;
  int i;
  int score;
  uint local_18;
  uint local_14;
  int local_10;
  
  local_10 = 0;
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
      if ((*(char *)((long)in_RDI + (long)(int)local_18 + (long)(int)local_14 * 3 + 8) == '\0') &&
         (uVar1 = (**(code **)(*in_RDI + 0x38))(in_RDI,local_14,local_18,in_ESI), (uVar1 & 1) != 0))
      {
        local_10 = local_10 + 1;
      }
      if (*(byte *)((long)in_RDI + (long)(int)local_18 + (long)(int)local_14 * 3 + 8) == in_ESI) {
        local_10 = local_10 + 1;
      }
    }
  }
  return local_10;
}

Assistant:

virtual int get_player_score(int player) const
	{
		int score = 0;
		for (int i = 0; i < M; ++i) {
		for (int j = 0; j < N; ++j) {
			if (board[i][j] == empty) {
				if (is_eye(i, j, player)) {
					score++;
				}
			}
			if (board[i][j] == player) {
				score++;
			}
		}}
		return score;
	}